

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_turtle.cc
# Opt level: O2

void __thiscall PainterTest_CanDrawSomething_Test::TestBody(PainterTest_CanDrawSomething_Test *this)

{
  TypedExpectation<void_()> *this_00;
  MockTurtle *in_RSI;
  Cardinality CStack_228;
  AssertionResult gtest_ar_;
  MockTurtle turtle;
  
  MockTurtle::MockTurtle(&turtle);
  gtest_ar_._0_8_ = MockTurtle::gmock_PenDown((MockSpec<void_()> *)&turtle,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                      ((MockSpec<void_()> *)&gtest_ar_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/tests/test_turtle.cc"
                       ,0xb,"turtle","PenDown()");
  testing::AtLeast((testing *)&CStack_228,1);
  testing::internal::ExpectationBase::UntypedTimes(&this_00->super_ExpectationBase,&CStack_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&CStack_228.impl_.
              super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*turtle.super_Turtle._vptr_Turtle[3])();
  gtest_ar_.success_ = true;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  MockTurtle::~MockTurtle(&turtle);
  return;
}

Assistant:

TEST(PainterTest, CanDrawSomething)
{
    MockTurtle turtle;             // #2

    EXPECT_CALL(turtle, PenDown()) // #3
        .Times(AtLeast(1));

    Painter painter(&turtle); // #4

    EXPECT_TRUE(painter.DrawCircle(0, 0, 10));
}